

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O3

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_graph_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *graph_file_name)

{
  pointer puVar1;
  char cVar2;
  istream *piVar3;
  long *plVar4;
  subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>
  *in_R9;
  int source;
  int neighb;
  string line;
  ifstream input;
  stringstream stream;
  int local_420;
  int local_41c;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined4 local_3f8 [2];
  undefined8 local_3f0;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_3e0;
  long local_3c0 [65];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  remove_edges(this,&this->one_skeleton);
  std::ifstream::ifstream(local_3c0,(string *)graph_file_name,_S_in);
  local_418 = &local_408;
  local_410 = 0;
  local_408 = 0;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)local_3c0);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3c0,(string *)&local_418,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_418,_S_out|_S_in);
    std::istream::operator>>((istream *)local_1b8,&local_420);
    while( true ) {
      plVar4 = (long *)std::istream::operator>>((istream *)local_1b8,&local_41c);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
      puVar1 = (this->vertices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_3f8[0] = 0;
      local_3f0 = 0;
      boost::
      add_edge<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>
                (&local_3e0,(boost *)puVar1[local_420],puVar1[local_41c],
                 (vertex_descriptor)local_3f8,(edge_property_type *)&this->one_skeleton,in_R9);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
  }
  std::ifstream::~ifstream(local_3c0);
  return;
}

Assistant:

void set_graph_from_file(const std::string& graph_file_name) {
    remove_edges(one_skeleton);
    int neighb;
    std::ifstream input(graph_file_name);
    std::string line;
    int source;
    while (std::getline(input, line)) {
      std::stringstream stream(line);
      stream >> source;
      while (stream >> neighb) boost::add_edge(vertices[source], vertices[neighb], one_skeleton);
    }
  }